

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O0

bool __thiscall libDAI::ClusterGraph::isMaximal(ClusterGraph *this,size_t I)

{
  bool bVar1;
  reference puVar2;
  unsigned_long in_RSI;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RDI;
  nb_cit J;
  nb_cit i;
  bool maximal;
  VarSet *clI;
  VarSet *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  byte in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  unsigned_long *local_30;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  byte local_19;
  VarSet *local_18;
  unsigned_long local_10;
  
  local_10 = in_RSI;
  local_18 = BipartiteGraph<libDAI::Var,_libDAI::VarSet>::V2
                       ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,
                                          CONCAT24(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0))),
                        (size_t)in_stack_ffffffffffffff98);
  local_19 = 1;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nb2
            ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
             (size_t)in_stack_ffffffffffffff98);
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98
                 );
  while( true ) {
    BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nb2
              ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,
                                 CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
               (size_t)in_stack_ffffffffffffff98);
    local_30 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(in_stack_ffffffffffffffa6,
                                            CONCAT24(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0))),
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa7 = local_19;
    if (!bVar1) {
      in_stack_ffffffffffffffa7 = 0;
    }
    if ((in_stack_ffffffffffffffa7 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_28);
    BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nb1
              ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,
                                 CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
               (size_t)in_stack_ffffffffffffff98);
    local_38._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff98);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_28);
      BipartiteGraph<libDAI::Var,_libDAI::VarSet>::nb1
                ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
                 CONCAT17(in_stack_ffffffffffffffa7,
                          CONCAT16(in_stack_ffffffffffffffa6,
                                   CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
                 (size_t)in_stack_ffffffffffffff98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT24(in_stack_ffffffffffffffa4,
                                                       in_stack_ffffffffffffffa0))),
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa6 = local_19;
      if (!bVar1) {
        in_stack_ffffffffffffffa6 = 0;
      }
      if ((in_stack_ffffffffffffffa6 & 1) == 0) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38);
      if (*puVar2 != local_10) {
        in_stack_ffffffffffffff98 = local_18;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_38);
        BipartiteGraph<libDAI::Var,_libDAI::VarSet>::V2
                  ((BipartiteGraph<libDAI::Var,_libDAI::VarSet> *)
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,
                                     CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)))
                   ,(size_t)in_stack_ffffffffffffff98);
        bVar1 = VarSet::operator<<((VarSet *)
                                   CONCAT17(in_stack_ffffffffffffffa7,
                                            CONCAT16(in_stack_ffffffffffffffa6,
                                                     CONCAT24(in_stack_ffffffffffffffa4,
                                                              in_stack_ffffffffffffffa0))),
                                   in_stack_ffffffffffffff98);
        if (bVar1) {
          local_19 = 0;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(in_RDI,CONCAT13(in_stack_ffffffffffffffa7,
                                   CONCAT12(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4)));
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(in_RDI,CONCAT13(in_stack_ffffffffffffffa7,
                                 CONCAT12(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4)));
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool isMaximal( size_t I ) const {
                assert( I < nr2() );
                const VarSet & clI = V2(I);
                bool maximal = true;
                // The following may not be optimal, since it may repeatedly test the same cluster *J
                for( nb_cit i = nb2(I).begin(); i != nb2(I).end() && maximal; i++ )
                    for( nb_cit J = nb1(*i).begin(); J != nb1(*i).end() && maximal; J++ ) 
                        if( (*J != I) && (clI << V2(*J)) )
                            maximal = false;
                return maximal;
            }